

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O1

Stream * rw::wdgl::writeNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  int *piVar1;
  
  piVar1 = *(int **)((long)object + 0x98);
  if ((piVar1 != (int *)0x0) && (*piVar1 == 0xb)) {
    Stream::writeU32(stream,piVar1[1]);
    Stream::write32(stream,*(void **)(piVar1 + 2),piVar1[1] * 0x18);
    (*stream->_vptr_Stream[3])(stream,*(undefined8 *)(piVar1 + 6),(ulong)(uint)piVar1[4]);
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32, void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_WDGL)
		return stream;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	stream->writeU32(header->numAttribs);
	stream->write32(header->attribs, header->numAttribs*sizeof(AttribDesc));
	ASSERTLITTLE;
	stream->write8(header->data, header->dataSize);
	return stream;
}